

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
 __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
::
internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>const,std::pair<S2Loop*const,std::pair<int,bool>>const&,std::pair<S2Loop*const,std::pair<int,bool>>const*>>
          (btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
           *this,btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
                 iter)

{
  byte bVar1;
  bool bVar2;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  bVar3;
  undefined8 uStack_28;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_&,_const_std::pair<S2Loop_*const,_std::pair<int,_bool>_>_*>
  iter_local;
  
  iter_local.node._0_4_ = (uint)iter.node;
  uStack_28 = this;
  while( true ) {
    bVar2 = false;
    if (uStack_28 !=
        (btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
         *)0x0) {
      bVar1 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
              ::count((btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                       *)uStack_28);
      bVar2 = (uint)iter_local.node == bVar1;
    }
    if (!bVar2) break;
    bVar1 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
            ::position((btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                        *)uStack_28);
    iter_local.node._0_4_ = (uint)bVar1;
    uStack_28 = (btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
                 *)btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                   ::parent((btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                             *)uStack_28);
    bVar2 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
            ::leaf((btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                    *)uStack_28);
    if (bVar2) {
      uStack_28 = (btree<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
                   *)0x0;
    }
  }
  bVar3.position = (uint)iter_local.node;
  bVar3.node = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                *)uStack_28;
  bVar3._12_4_ = 0;
  return bVar3;
}

Assistant:

inline IterType btree<P>::internal_last(IterType iter) {
  while (iter.node && iter.position == iter.node->count()) {
    iter.position = iter.node->position();
    iter.node = iter.node->parent();
    if (iter.node->leaf()) {
      iter.node = nullptr;
    }
  }
  return iter;
}